

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadCurves(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *pvVar1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar2;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_00;
  string *psVar3;
  avector<Vec3ff> *paVar4;
  XML *pXVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  size_t i;
  undefined8 in_RCX;
  HairSetNode *pHVar9;
  undefined4 in_register_00000014;
  Hair HVar10;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  avector<Vec3ff> *positions;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  ulong uVar11;
  string tessellation_rate;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Ref<embree::XML> animation_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curveid;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_e0;
  HairSetNode *local_c0;
  undefined8 *local_b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  undefined1 local_68 [56];
  
  local_b8 = (undefined8 *)CONCAT44(in_register_00000014,type);
  psVar3 = (string *)*local_b8;
  local_68._24_8_ = in_RCX;
  std::__cxx11::string::string((string *)&local_e0,"material",(allocator *)&local_b0);
  XML::child((XML *)local_98,psVar3);
  loadMaterial((XMLLoader *)(local_68 + 0x28),xml);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_e0);
  local_c0 = (HairSetNode *)::operator_new(0x118);
  local_68._32_8_ = local_68._40_8_;
  local_68._48_8_ = this;
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x10))();
  }
  pHVar9 = local_c0;
  SceneGraph::HairSetNode::HairSetNode
            (local_c0,(RTCGeometryType)local_68._24_8_,
             (Ref<embree::SceneGraph::MaterialNode> *)(local_68 + 0x20),(BBox1f)0x3f80000000000000,0
            );
  (*(pHVar9->super_Node).super_RefCount._vptr_RefCount[2])(pHVar9);
  if ((_Base_ptr)local_68._32_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._32_8_ + 0x18))();
  }
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"animated_positions",(allocator *)local_98);
  XML::childOpt((XML *)&local_b0,psVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  pvVar1 = &local_c0->positions;
  if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start == (HairSetNode *)0x0) {
    psVar3 = (string *)*local_b8;
    std::__cxx11::string::string((string *)local_98,"positions",(allocator *)local_78);
    XML::childOpt((XML *)local_68,psVar3);
    loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)pvVar1,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_e0);
    alignedFree((void *)local_e0.field_2._8_8_);
    local_e0.field_2._8_8_ = (void *)0x0;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity = 0;
    if ((long *)local_68._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 0x18))();
    }
    std::__cxx11::string::~string((string *)local_98);
    pXVar5 = (XML *)*local_b8;
    std::__cxx11::string::string((string *)&local_e0,"positions2",(allocator *)local_98);
    bVar7 = XML::hasChild(pXVar5,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (bVar7) {
      psVar3 = (string *)*local_b8;
      std::__cxx11::string::string((string *)local_98,"positions2",(allocator *)local_78);
      XML::childOpt((XML *)local_68,psVar3);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0.field_2._8_8_ = (void *)0x0;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      if ((long *)local_68._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 0x18))();
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    for (uVar11 = 0;
        uVar11 < (ulong)((long)(((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)((long)local_b0._M_impl.super__Vector_impl_data._M_start + 0x78)
                                )->
                               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)(((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)((long)local_b0._M_impl.super__Vector_impl_data._M_start + 0x78)
                                )->
                               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish >> 3);
        uVar11 = uVar11 + 1) {
      XML::child((XML *)local_98,(size_t)local_b0._M_impl.super__Vector_impl_data._M_start);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0.field_2._8_8_ = (void *)0x0;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))();
      }
    }
  }
  if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
    (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount)._vptr_RefCount
      [3])();
  }
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"animated_normals",(allocator *)&local_b0);
  XML::childOpt((XML *)local_98,psVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    psVar3 = (string *)*local_b8;
    std::__cxx11::string::string((string *)&local_e0,"normals",(allocator *)local_68);
    XML::childOpt((XML *)&local_b0,psVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&local_c0->normals,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
        (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
          _vptr_RefCount[3])();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0017613c;
  }
  else {
    pvVar2 = &local_c0->normals;
    for (uVar11 = 0;
        uVar11 < (ulong)((long)*(_func_int **)(local_98._0_8_ + 0x88) -
                         (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               (local_98._0_8_ + 0x80))->_vptr__Sp_counted_base >> 3);
        uVar11 = uVar11 + 1) {
      XML::child((XML *)&local_b0,local_98._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar2,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0.field_2._8_8_ = (void *)0x0;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
        (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
          _vptr_RefCount[3])();
      }
    }
LAB_0017613c:
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))(local_98._0_8_);
  }
  if (2 < local_68._24_4_ - 0x28) goto LAB_00176445;
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"animated_tangents",(allocator *)&local_b0);
  XML::childOpt((XML *)local_98,psVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    psVar3 = (string *)*local_b8;
    std::__cxx11::string::string((string *)&local_e0,"tangents",(allocator *)local_68);
    XML::childOpt((XML *)&local_b0,psVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&local_c0->tangents,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
        (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
          _vptr_RefCount[3])();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001762bf;
  }
  else {
    pvVar1 = &local_c0->tangents;
    for (uVar11 = 0;
        uVar11 < (ulong)((long)*(_func_int **)(local_98._0_8_ + 0x88) -
                         (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               (local_98._0_8_ + 0x80))->_vptr__Sp_counted_base >> 3);
        uVar11 = uVar11 + 1) {
      XML::child((XML *)&local_b0,local_98._0_8_);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0.field_2._8_8_ = (void *)0x0;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
        (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
          _vptr_RefCount[3])();
      }
    }
LAB_001762bf:
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))(local_98._0_8_);
  }
  if (local_68._24_4_ == 0x2a) {
    psVar3 = (string *)*local_b8;
    std::__cxx11::string::string
              ((string *)&local_e0,"animated_normal_derivatives",(allocator *)&local_b0);
    XML::childOpt((XML *)local_98,psVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      psVar3 = (string *)*local_b8;
      std::__cxx11::string::string((string *)&local_e0,"normal_derivatives",(allocator *)local_68);
      XML::childOpt((XML *)&local_b0,psVar3);
      std::__cxx11::string::~string((string *)&local_e0);
      if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
        loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0)
        ;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)&local_c0->dnormals,
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0)
        {
          (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
            _vptr_RefCount[3])();
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00176445;
    }
    else {
      pvVar2 = &local_c0->dnormals;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)*(_func_int **)(local_98._0_8_ + 0x88) -
                           (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 (local_98._0_8_ + 0x80))->_vptr__Sp_counted_base >> 3);
          uVar11 = uVar11 + 1) {
        XML::child((XML *)&local_b0,local_98._0_8_);
        loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0)
        ;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)pvVar2,
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        local_e0.field_2._8_8_ = (void *)0x0;
        local_e0._M_string_length = 0;
        local_e0.field_2._M_allocated_capacity = 0;
        if ((HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start != (HairSetNode *)0x0)
        {
          (*(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->super_RefCount).
            _vptr_RefCount[3])();
        }
      }
    }
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))(local_98._0_8_);
  }
LAB_00176445:
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"indices",(allocator *)local_68);
  XML::childOpt((XML *)local_98,psVar3);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_e0);
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"curveid",(allocator *)local_78);
  XML::childOpt((XML *)local_98,psVar3);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_e0);
  local_e0._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
             (long)local_b0._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b0._M_impl.super__Vector_impl_data._M_start >> 2,
             (value_type_conflict2 *)&local_e0);
  this_00 = &local_c0->hairs;
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(this_00,(long)local_b0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_b0._M_impl.super__Vector_impl_data._M_start >> 2);
  for (uVar11 = 0;
      uVar11 < (ulong)((long)local_b0._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b0._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar11 = uVar11 + 1) {
    HVar10.id = *(uint *)(local_68._0_8_ + uVar11 * 4);
    HVar10.vertex =
         *(uint *)((long)&(((Node *)local_b0._M_impl.super__Vector_impl_data._M_start)->
                          super_RefCount)._vptr_RefCount + uVar11 * 4);
    (this_00->
    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar11] = HVar10;
  }
  psVar3 = (string *)*local_b8;
  std::__cxx11::string::string((string *)&local_e0,"flags",(allocator *)(local_78 + 0xf));
  XML::childOpt((XML *)local_78,psVar3);
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,(XMLLoader *)xml,
                 (Ref<embree::XML> *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&local_c0->flags,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  pHVar9 = (HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start;
  if ((XML *)local_78._0_8_ != (XML *)0x0) {
    (*((RefCount *)local_78._0_8_)->_vptr_RefCount[3])();
    pHVar9 = (HairSetNode *)local_b0._M_impl.super__Vector_impl_data._M_start;
  }
  std::__cxx11::string::~string((string *)&local_e0);
  if (local_68._24_4_ - 0x20 < 3) {
    paVar4 = (local_c0->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (positions = (local_c0->positions).
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; positions != paVar4;
        positions = positions + 1) {
      fix_bspline_end_points
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,positions);
    }
  }
  pXVar5 = (XML *)*local_b8;
  std::__cxx11::string::string((string *)local_98,"tessellation_rate",(allocator *)local_78);
  XML::parm(&local_e0,pXVar5,(string *)local_98);
  uVar6 = local_68._48_8_;
  std::__cxx11::string::~string((string *)local_98);
  ctx = (EVP_PKEY_CTX *)0x2243be;
  bVar7 = std::operator!=(&local_e0,"");
  sig = extraout_RDX;
  if (bVar7) {
    uVar8 = atoi((char *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_));
    local_c0->tessellation_rate = uVar8;
    pHVar9 = local_c0;
    sig = extraout_RDX_00;
  }
  SceneGraph::HairSetNode::verify(local_c0,ctx,sig,(size_t)pHVar9,in_R8,in_R9);
  *(HairSetNode **)uVar6 = local_c0;
  (*(local_c0->super_Node).super_RefCount._vptr_RefCount[2])();
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b0);
  (*(local_c0->super_Node).super_RefCount._vptr_RefCount[3])();
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)uVar6;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadCurves(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) {
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
      }
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    if (type == RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_tangents")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->tangents.push_back(loadVec3ffArray(animation->child(i)));
        }
      } else if (Ref<XML> tangents = xml->childOpt("tangents")) {
        mesh->tangents.push_back(loadVec3ffArray(tangents));
      }
    }

    if (type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_normal_derivatives")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->dnormals.push_back(loadVec3faArray(animation->child(i)));
        }
      } else if (Ref<XML> dnormals = xml->childOpt("normal_derivatives")) {
        mesh->dnormals.push_back(loadVec3faArray(dnormals));
      }
    }

    std::vector<unsigned> indices = loadUIntArray(xml->childOpt("indices"));
    std::vector<unsigned> curveid = loadUIntArray(xml->childOpt("curveid"));
    curveid.resize(indices.size(),0);
    mesh->hairs.resize(indices.size());
    for (size_t i=0; i<indices.size(); i++) {
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i],
                                                     curveid[i]);
    }

    mesh->flags = loadUCharArray(xml->childOpt("flags"));
    
    if (type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE)
    {
      for (auto& vertices : mesh->positions)
        fix_bspline_end_points(indices,vertices);
    }

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }